

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O2

void __thiscall
QConcatenateTablesProxyModelPrivate::slotDataChanged
          (QConcatenateTablesProxyModelPrivate *this,QModelIndex *from,QModelIndex *to,
          QList<int> *roles)

{
  int iVar1;
  QObject *this_00;
  long in_FS_OFFSET;
  undefined1 *local_88;
  undefined1 *puStack_80;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_78;
  undefined1 *local_68;
  undefined1 *puStack_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = this->m_columnCount;
  if (from->c < iVar1) {
    this_00 = (this->super_QAbstractItemModelPrivate).super_QObjectPrivate.super_QObjectData.q_ptr;
    local_48.m.ptr = (to->m).ptr;
    local_48.r = to->r;
    local_48.c = to->c;
    local_48.i = to->i;
    if (iVar1 <= to->c) {
      QModelIndex::siblingAtColumn(&local_48,to,iVar1 + -1);
    }
    local_58.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QConcatenateTablesProxyModel::mapFromSource
              ((QModelIndex *)&local_68,(QConcatenateTablesProxyModel *)this_00,from);
    local_78.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    QConcatenateTablesProxyModel::mapFromSource
              ((QModelIndex *)&local_88,(QConcatenateTablesProxyModel *)this_00,&local_48);
    QAbstractItemModel::dataChanged
              ((QAbstractItemModel *)this_00,(QModelIndex *)&local_68,(QModelIndex *)&local_88,roles
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QConcatenateTablesProxyModelPrivate::slotDataChanged(const QModelIndex &from,
                                                          const QModelIndex &to,
                                                          const QList<int> &roles)
{
    Q_Q(QConcatenateTablesProxyModel);
    Q_ASSERT(from.isValid());
    Q_ASSERT(to.isValid());
    if (from.column() >= m_columnCount)
        return;
    QModelIndex adjustedTo = to;
    if (to.column() >= m_columnCount)
        adjustedTo = to.siblingAtColumn(m_columnCount - 1);
    const QModelIndex myFrom = q->mapFromSource(from);
    Q_ASSERT(q->checkIndex(myFrom, QAbstractItemModel::CheckIndexOption::IndexIsValid));
    const QModelIndex myTo = q->mapFromSource(adjustedTo);
    Q_ASSERT(q->checkIndex(myTo, QAbstractItemModel::CheckIndexOption::IndexIsValid));
    emit q->dataChanged(myFrom, myTo, roles);
}